

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O3

BasicBlock * __thiscall
FlowGraph::AddBlock(FlowGraph *this,Instr *firstInstr,Instr *lastInstr,BasicBlock *nextBlock,
                   BasicBlock *prevBlock)

{
  char cVar1;
  Kind KVar2;
  long *plVar3;
  long lVar4;
  Type pBVar5;
  code *pcVar6;
  bool bVar7;
  BOOLEAN BVar8;
  IRKind IVar9;
  uint uVar10;
  BOOL BVar11;
  LabelInstr *pLVar12;
  BasicBlock *pBVar13;
  undefined4 *puVar14;
  BasicBlock *pBVar15;
  MultiBranchInstr *pMVar16;
  BVSparseNode *pBVar17;
  BranchInstr *this_00;
  OpCode OVar18;
  long lVar19;
  long *plVar20;
  ulong uVar21;
  BVSparseNode *pBVar22;
  int iVar23;
  BasicBlock **ppBVar24;
  BranchDictionary *branchDictionary;
  BVSparse<Memory::JitArenaAllocator> local_78;
  BasicBlock *local_58;
  LabelInstr *local_50;
  long *local_48;
  Instr *local_40;
  BasicBlock *local_38;
  
  pLVar12 = (LabelInstr *)firstInstr;
  local_58 = nextBlock;
  if ((firstInstr->m_kind != InstrKindLabel) && (firstInstr->m_kind != InstrKindProfiledLabel)) {
    pLVar12 = IR::LabelInstr::New(Label,firstInstr->m_func,false);
    IR::Instr::SetByteCodeOffset(&pLVar12->super_Instr,firstInstr);
    if (firstInstr->m_kind == InstrKindEntry) {
      IR::Instr::InsertAfter(firstInstr,&pLVar12->super_Instr);
    }
    else {
      IR::Instr::InsertBefore(firstInstr,&pLVar12->super_Instr);
    }
  }
  pBVar13 = pLVar12->m_block;
  local_50 = pLVar12;
  if (pBVar13 == (BasicBlock *)0x0) {
    pBVar13 = BasicBlock::New(this);
    if ((pBVar13 != (BasicBlock *)0x0) && (pLVar12->m_block != (BasicBlock *)0x0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar14 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x2c8,"(this->m_block == nullptr || block == nullptr)",
                         "Overwriting existing block pointer");
      if (!bVar7) goto LAB_00410f16;
      *puVar14 = 0;
      pLVar12 = local_50;
    }
    pLVar12->m_block = pBVar13;
    if (this->tailBlock == (BasicBlock *)0x0) {
      this->tailBlock = pBVar13;
    }
  }
  IVar9 = lastInstr->m_kind;
  if (IVar9 == InstrKindBranch) {
LAB_00410a0e:
    pLVar12 = (LabelInstr *)lastInstr[1].m_next;
    cVar1 = *(char *)((long)&lastInstr[1]._vptr_Instr + 1);
    if (pLVar12 == (LabelInstr *)0x0) {
      if (cVar1 == '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x20e,"(m_isMultiBranch)","m_isMultiBranch");
        if (!bVar7) goto LAB_00410f16;
        *puVar14 = 0;
      }
      pMVar16 = IR::BranchInstr::AsMultiBrInstr((BranchInstr *)lastInstr);
      local_78.alloc = ((pMVar16->super_BranchInstr).super_Instr.m_func)->m_alloc;
      local_78.lastUsedNodePrevNextField = &local_78.head;
      local_78.head = (BVSparseNode *)0x0;
      local_78.lastFoundIndex = (Type_conflict)0x0;
      plVar3 = (long *)pMVar16->m_branchTargets;
      if (plVar3 != (long *)0x0) {
        KVar2 = pMVar16->m_kind;
        if ((KVar2 == IntJumpTable) || (KVar2 == SingleCharStrJumpTable)) {
          lVar19 = pMVar16->m_baseCaseValue;
          plVar20 = plVar3 + 1;
          local_38 = pBVar13;
          if (lVar19 <= pMVar16->m_lastCaseValue) {
            lVar4 = *plVar3;
            local_48 = plVar3 + 1;
            local_40 = lastInstr;
            do {
              pLVar12 = *(LabelInstr **)(lVar4 + pMVar16->m_baseCaseValue * -8 + lVar19 * 8);
              BVar8 = BVSparse<Memory::JitArenaAllocator>::Test(&local_78,pLVar12->m_id);
              if (BVar8 == '\0') {
                BVSparse<Memory::JitArenaAllocator>::Set(&local_78,pLVar12->m_id);
                pBVar13 = SetBlockTargetAndLoopFlag(this,pLVar12);
                AddEdge(this,local_38,pBVar13);
              }
              lVar19 = lVar19 + 1;
              plVar20 = local_48;
              lastInstr = local_40;
              pBVar13 = local_38;
            } while (lVar19 <= pMVar16->m_lastCaseValue);
          }
        }
        else {
          if (KVar2 != StrDictionary) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar14 = 1;
            Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                       ,0x435,"(false)","false");
            goto LAB_00410f16;
          }
          uVar10 = *(uint *)((long)plVar3 + 0x1c);
          plVar20 = plVar3 + 7;
          if (uVar10 != 0) {
            uVar21 = 0;
            local_48 = plVar3 + 7;
            local_40 = lastInstr;
            local_38 = pBVar13;
            do {
              iVar23 = *(int *)(*plVar3 + uVar21 * 4);
              if (iVar23 != -1) {
                do {
                  lVar19 = (long)iVar23;
                  iVar23 = *(int *)(plVar3[1] + 8 + lVar19 * 0x18);
                  pLVar12 = *(LabelInstr **)(plVar3[1] + lVar19 * 0x18);
                  BVar8 = BVSparse<Memory::JitArenaAllocator>::Test(&local_78,pLVar12->m_id);
                  if (BVar8 == '\0') {
                    BVSparse<Memory::JitArenaAllocator>::Set(&local_78,pLVar12->m_id);
                    pBVar13 = SetBlockTargetAndLoopFlag(this,pLVar12);
                    AddEdge(this,local_38,pBVar13);
                  }
                } while (iVar23 != -1);
                uVar10 = *(uint *)((long)plVar3 + 0x1c);
                lastInstr = local_40;
              }
              uVar21 = uVar21 + 1;
              plVar20 = local_48;
              pBVar13 = local_38;
            } while (uVar21 < uVar10);
          }
        }
        pLVar12 = (LabelInstr *)*plVar20;
        BVar8 = BVSparse<Memory::JitArenaAllocator>::Test(&local_78,pLVar12->m_id);
        if (BVar8 == '\0') {
          BVSparse<Memory::JitArenaAllocator>::Set(&local_78,pLVar12->m_id);
          pBVar15 = SetBlockTargetAndLoopFlag(this,pLVar12);
          AddEdge(this,pBVar13,pBVar15);
        }
      }
      if (local_78.head != (BVSparseNode *)0x0) {
        pBVar5 = local_78.head;
        pBVar22 = (local_78.alloc)->bvFreeList;
        do {
          pBVar17 = pBVar5;
          pBVar5 = pBVar17->next;
          pBVar17->next = pBVar22;
          pBVar22 = pBVar17;
        } while (pBVar5 != (Type)0x0);
        (local_78.alloc)->bvFreeList = pBVar17;
      }
    }
    else {
      if (cVar1 != '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x209,"(!m_isMultiBranch)","!m_isMultiBranch");
        if (!bVar7) goto LAB_00410f16;
        *puVar14 = 0;
        pLVar12 = (LabelInstr *)lastInstr[1].m_next;
      }
      pBVar15 = SetBlockTargetAndLoopFlag(this,pLVar12);
      OVar18 = lastInstr->m_opcode;
      if (OVar18 < ADD) {
        if ((OVar18 != Br) && (OVar18 != MultiBr)) goto LAB_00410c28;
      }
      else {
        bVar7 = LowererMD::IsUnconditionalBranch(lastInstr);
        if (!bVar7) {
LAB_00410c28:
          pLVar12 = (LabelInstr *)IR::Instr::GetNextRealInstrOrLabel(lastInstr);
          IVar9 = (pLVar12->super_Instr).m_kind;
          if ((IVar9 == InstrKindProfiledLabel) || (IVar9 == InstrKindLabel)) {
            SetBlockTargetAndLoopFlag(this,pLVar12);
          }
        }
      }
LAB_00410c49:
      if (pBVar15 != (BasicBlock *)0x0) {
        AddEdge(this,pBVar13,pBVar15);
      }
    }
LAB_00410d5f:
    IVar9 = lastInstr->m_kind;
    pLVar12 = local_50;
  }
  else {
    if (IVar9 == InstrKindExit) {
      OVar18 = lastInstr->m_opcode;
LAB_00410aac:
      if ((OVar18 == Ret) && (pBVar15 = this->tailBlock, pBVar13 != pBVar15)) goto LAB_00410c49;
      goto LAB_00410d5f;
    }
    OVar18 = lastInstr->m_opcode;
    if ((OVar18 - 0x23 < 3) || (OVar18 - 0x173 < 2)) {
      if (IVar9 == InstrKindBranch) goto LAB_00410a0e;
      goto LAB_00410aac;
    }
  }
  if (IVar9 == InstrKindBranch) {
    OVar18 = lastInstr->m_opcode;
    if (OVar18 < ADD) {
      if ((OVar18 == Br) || (OVar18 == MultiBr)) goto LAB_00410e79;
    }
    else {
      bVar7 = LowererMD::IsUnconditionalBranch(lastInstr);
      if (bVar7) goto LAB_00410e79;
    }
  }
  bVar7 = OpCodeAttr::HasFallThrough(lastInstr->m_opcode);
  if (bVar7) {
    BVar11 = Func::HasTry(this->func);
    if ((BVar11 == 0) && (lastInstr->m_kind != InstrKindBranch)) {
      pLVar12 = (LabelInstr *)lastInstr->m_next;
      IVar9 = (pLVar12->super_Instr).m_kind;
      if ((IVar9 != InstrKindLabel) && (IVar9 != InstrKindProfiledLabel)) {
        AssertCount = AssertCount + 1;
        local_40 = lastInstr;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar14 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
        if (!bVar7) {
LAB_00410f16:
          pcVar6 = (code *)invalidInstructionException();
          (*pcVar6)();
        }
        *puVar14 = 0;
        lastInstr = local_40;
      }
      this_00 = IR::BranchInstr::New(Br,pLVar12,lastInstr->m_func);
      IR::Instr::SetByteCodeOffset(&this_00->super_Instr,lastInstr->m_next);
      IR::Instr::InsertAfter(lastInstr,&this_00->super_Instr);
      pLVar12 = local_50;
    }
    AddEdge(this,pBVar13,local_58);
  }
LAB_00410e79:
  uVar10 = this->blockCount;
  this->blockCount = uVar10 + 1;
  pBVar13->number = uVar10;
  pBVar13->firstInstr = &pLVar12->super_Instr;
  if (prevBlock == (BasicBlock *)0x0) {
    pBVar15 = this->blockList;
    if (pBVar15 != (BasicBlock *)0x0) {
      pBVar15->prev = pBVar13;
    }
    ppBVar24 = &this->blockList;
    pBVar13->next = pBVar15;
  }
  else {
    prevBlock->next = pBVar13;
    pBVar13->prev = prevBlock;
    pBVar13->next = local_58;
    ppBVar24 = &local_58->prev;
  }
  *ppBVar24 = pBVar13;
  return pBVar13;
}

Assistant:

BasicBlock *
FlowGraph::AddBlock(
    IR::Instr * firstInstr,
    IR::Instr * lastInstr,
    BasicBlock * nextBlock,
    BasicBlock *prevBlock)
{
    BasicBlock * block;
    IR::LabelInstr * labelInstr;

    if (firstInstr->IsLabelInstr())
    {
        labelInstr = firstInstr->AsLabelInstr();
    }
    else
    {
        labelInstr = IR::LabelInstr::New(Js::OpCode::Label, firstInstr->m_func);
        labelInstr->SetByteCodeOffset(firstInstr);
        if (firstInstr->IsEntryInstr())
        {
            firstInstr->InsertAfter(labelInstr);
        }
        else
        {
            firstInstr->InsertBefore(labelInstr);
        }
        firstInstr = labelInstr;
    }

    block = labelInstr->GetBasicBlock();
    if (block == nullptr)
    {
        block = BasicBlock::New(this);
        labelInstr->SetBasicBlock(block);
        // Remember last block in function to target successor of RETs.
        if (!this->tailBlock)
        {
            this->tailBlock = block;
        }
    }

    // Hook up the successor edges
    if (lastInstr->EndsBasicBlock())
    {
        BasicBlock * blockTarget = nullptr;

        if (lastInstr->IsBranchInstr())
        {
            // Hook up a successor edge to the branch target.
            IR::BranchInstr * branchInstr = lastInstr->AsBranchInstr();

            if(branchInstr->IsMultiBranch())
            {
                BasicBlock * blockMultiBrTarget;

                IR::MultiBranchInstr * multiBranchInstr = branchInstr->AsMultiBrInstr();

                multiBranchInstr->MapUniqueMultiBrLabels([&](IR::LabelInstr * labelInstr) -> void
                {
                    blockMultiBrTarget = SetBlockTargetAndLoopFlag(labelInstr);
                    this->AddEdge(block, blockMultiBrTarget);
                });
            }
            else
            {
                IR::LabelInstr * targetLabelInstr = branchInstr->GetTarget();
                blockTarget = SetBlockTargetAndLoopFlag(targetLabelInstr);
                if (branchInstr->IsConditional())
                {
                    IR::Instr *instrNext = branchInstr->GetNextRealInstrOrLabel();

                    if (instrNext->IsLabelInstr())
                    {
                        SetBlockTargetAndLoopFlag(instrNext->AsLabelInstr());
                    }
                }
            }
        }
        else if (lastInstr->m_opcode == Js::OpCode::Ret && block != this->tailBlock)
        {
            blockTarget = this->tailBlock;
        }

        if (blockTarget)
        {
            this->AddEdge(block, blockTarget);
        }
    }

    if (lastInstr->HasFallThrough())
    {
        // Add a branch to next instruction so that we don't have to update the flow graph
        // when the glob opt tries to insert instructions.
        // We don't run the globopt with try/catch, don't need to insert branch to next for fall through blocks.
        if (!this->func->HasTry() && !lastInstr->IsBranchInstr())
        {
            IR::BranchInstr * instr = IR::BranchInstr::New(Js::OpCode::Br,
                lastInstr->m_next->AsLabelInstr(), lastInstr->m_func);
            instr->SetByteCodeOffset(lastInstr->m_next);
            lastInstr->InsertAfter(instr);
            lastInstr = instr;
        }
        this->AddEdge(block, nextBlock);
    }

    block->SetBlockNum(this->blockCount++);
    block->SetFirstInstr(firstInstr);
    block->SetLastInstr(lastInstr);

    if (!prevBlock)
    {
        if (this->blockList)
        {
            this->blockList->prev = block;
        }
        block->next = this->blockList;
        this->blockList = block;
    }
    else
    {
        prevBlock->next = block;
        block->prev = prevBlock;
        block->next = nextBlock;
        nextBlock->prev = block;
    }
    return block;
}